

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.cpp
# Opt level: O3

QuartetSet * GenerateQuartetTargets(QuartetSet *__return_storage_ptr__,QAM *am)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  Gaussian cur4;
  Gaussian cur3;
  Gaussian cur2;
  Gaussian cur1;
  Doublet ket;
  Doublet bra;
  Gaussian local_1a8;
  Gaussian local_19c;
  Gaussian local_190;
  Gaussian local_184;
  ulong local_178;
  ulong local_170;
  ulong local_168;
  ulong local_160;
  DoubletType local_158;
  undefined8 uStack_154;
  int iStack_14c;
  undefined8 local_148;
  int local_140;
  undefined1 *local_138;
  long local_130;
  undefined1 local_128 [16];
  DoubletType local_118;
  undefined8 uStack_114;
  int iStack_10c;
  undefined8 local_108;
  int local_100;
  undefined1 *local_f8;
  long local_f0;
  undefined1 local_e8 [16];
  undefined1 local_d8 [32];
  _Alloc_hider local_b8;
  char local_a8 [16];
  DoubletType DStack_98;
  int iStack_94;
  int iStack_90;
  int local_8c;
  int iStack_88;
  int iStack_84;
  int iStack_80;
  _Alloc_hider local_78;
  char local_68 [16];
  int local_58;
  _Alloc_hider local_50;
  char local_40 [16];
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_184.ijk._M_elems[0] = (am->qam)._M_elems[0];
  iVar10 = (am->qam)._M_elems[1];
  iVar3 = (local_184.ijk._M_elems[0] + 2) * (local_184.ijk._M_elems[0] + 1);
  iVar4 = (am->qam)._M_elems[2];
  iVar9 = (am->qam)._M_elems[3];
  local_178 = 0;
  local_184.ijk._M_elems[1] = 0;
  local_184.ijk._M_elems[2] = 0;
  if (1 < iVar3) {
    uVar7 = (iVar10 + 2) * (iVar10 + 1);
    local_170 = (ulong)uVar7;
    uVar6 = (iVar4 + 2) * (iVar4 + 1);
    local_168 = (ulong)uVar6;
    uVar8 = (iVar9 + 2) * (iVar9 + 1);
    local_160 = (ulong)uVar8;
    do {
      local_190.ijk._M_elems[0] = (am->qam)._M_elems[1];
      local_190.ijk._M_elems[1] = 0;
      local_190.ijk._M_elems[2] = 0;
      if (1 < (int)local_170) {
        iVar10 = 0;
        do {
          local_118 = BRA;
          iStack_10c = local_184.ijk._M_elems[2];
          uStack_114 = CONCAT44(local_184.ijk._M_elems[1],local_184.ijk._M_elems[0]);
          local_100 = local_190.ijk._M_elems[2];
          local_108 = CONCAT44(local_190.ijk._M_elems[1],local_190.ijk._M_elems[0]);
          local_f8 = local_e8;
          pcVar2 = (am->tag)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f8,pcVar2,pcVar2 + (am->tag)._M_string_length);
          local_19c.ijk._M_elems[0] = (am->qam)._M_elems[2];
          local_19c.ijk._M_elems[1] = 0;
          local_19c.ijk._M_elems[2] = 0;
          if (1 < (int)local_168) {
            iVar4 = 0;
            do {
              local_1a8.ijk._M_elems[0] = (am->qam)._M_elems[3];
              local_1a8.ijk._M_elems[1] = 0;
              local_1a8.ijk._M_elems[2] = 0;
              iVar9 = (int)uVar8 / 2;
              if (1 < (int)local_160) {
                do {
                  local_158 = KET;
                  iStack_14c = local_19c.ijk._M_elems[2];
                  uStack_154 = CONCAT44(local_19c.ijk._M_elems[1],local_19c.ijk._M_elems[0]);
                  local_140 = local_1a8.ijk._M_elems[2];
                  local_148 = CONCAT44(local_1a8.ijk._M_elems[1],local_1a8.ijk._M_elems[0]);
                  local_138 = local_128;
                  pcVar2 = (am->tag)._M_dataplus._M_p;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_138,pcVar2,pcVar2 + (am->tag)._M_string_length);
                  local_d8._16_4_ = (int)local_108;
                  local_d8._20_4_ = local_108._4_4_;
                  local_d8._24_4_ = local_100;
                  local_d8._0_4_ = local_118;
                  local_d8._4_4_ = (int)uStack_114;
                  local_d8._8_4_ = uStack_114._4_4_;
                  local_d8._12_4_ = iStack_10c;
                  local_b8._M_p = local_a8;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_b8,local_f8,local_f8 + local_f0);
                  iStack_88 = (int)local_148;
                  iStack_84 = local_148._4_4_;
                  iStack_80 = local_140;
                  DStack_98 = local_158;
                  iStack_94 = (int)uStack_154;
                  iStack_90 = uStack_154._4_4_;
                  local_8c = iStack_14c;
                  local_78._M_p = local_68;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_78,local_138,local_138 + local_130);
                  local_58 = 0;
                  pcVar2 = (am->tag)._M_dataplus._M_p;
                  local_50._M_p = local_40;
                  std::__cxx11::string::_M_construct<char*>
                            ((string *)&local_50,pcVar2,pcVar2 + (am->tag)._M_string_length);
                  std::
                  _Rb_tree<Quartet,_Quartet,_std::_Identity<Quartet>,_std::less<Quartet>,_std::allocator<Quartet>_>
                  ::_M_insert_unique<Quartet>(&__return_storage_ptr__->_M_t,(Quartet *)local_d8);
                  if (local_50._M_p != local_40) {
                    operator_delete(local_50._M_p);
                  }
                  if (local_78._M_p != local_68) {
                    operator_delete(local_78._M_p);
                  }
                  if (local_b8._M_p != local_a8) {
                    operator_delete(local_b8._M_p);
                  }
                  Gaussian::Iterate(&local_1a8);
                  if (local_138 != local_128) {
                    operator_delete(local_138);
                  }
                  iVar9 = iVar9 + -1;
                } while (iVar9 != 0);
              }
              Gaussian::Iterate(&local_19c);
              iVar4 = iVar4 + 1;
            } while (iVar4 != (int)uVar6 / 2);
          }
          Gaussian::Iterate(&local_190);
          if (local_f8 != local_e8) {
            operator_delete(local_f8);
          }
          iVar10 = iVar10 + 1;
        } while (iVar10 != (int)uVar7 / 2);
      }
      Gaussian::Iterate(&local_184);
      uVar5 = (int)local_178 + 1;
      local_178 = (ulong)uVar5;
    } while (uVar5 != iVar3 / 2);
  }
  return __return_storage_ptr__;
}

Assistant:

QuartetSet GenerateQuartetTargets(QAM am)
{
    QuartetSet qs;
    int nam1 = ((am[0] + 1) * (am[0] + 2)) / 2;
    int nam2 = ((am[1] + 1) * (am[1] + 2)) / 2;
    int nam3 = ((am[2] + 1) * (am[2] + 2)) / 2;
    int nam4 = ((am[3] + 1) * (am[3] + 2)) / 2;

    Gaussian cur1 = Gaussian{am[0], 0, 0};
    for(int i = 0; i < nam1; i++)
    {
        Gaussian cur2 = Gaussian{am[1], 0, 0};
        for(int j = 0; j < nam2; j++)
        {
            Doublet bra{DoubletType::BRA, cur1, cur2, am.tag};
            Gaussian cur3 = Gaussian{am[2], 0, 0};
            for(int k = 0; k < nam3; k++)
            {
                Gaussian cur4 = Gaussian{am[3], 0, 0};
                for(int l = 0; l < nam4; l++)
                {
                    Doublet ket{DoubletType::KET, cur3, cur4, am.tag};
                    qs.insert(Quartet{bra, ket, 0, am.tag});
                    cur4.Iterate();
                } 

                cur3.Iterate();
            }

            cur2.Iterate(); 
        }       
                
        cur1.Iterate();
    }
                
    return qs;
}